

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content-parser.c
# Opt level: O1

char * blogc_htmlentities(char *str)

{
  char c;
  bc_string_t *str_00;
  char *pcVar1;
  
  if (str != (char *)0x0) {
    str_00 = bc_string_new();
    c = *str;
    if (c != '\0') {
      pcVar1 = str + 1;
      do {
        htmlentities_append(str_00,c);
        c = *pcVar1;
        pcVar1 = pcVar1 + 1;
      } while (c != '\0');
    }
    pcVar1 = bc_string_free(str_00,false);
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

char*
blogc_htmlentities(const char *str)
{
    if (str == NULL)
        return NULL;
    bc_string_t *rv = bc_string_new();
    for (size_t i = 0; str[i] != '\0'; i++)
        htmlentities_append(rv, str[i]);
    return bc_string_free(rv, false);
}